

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O2

Tuple4d * math::reflect(Tuple4d *__return_storage_ptr__,Tuple4d *in,Tuple4d *normal)

{
  double s;
  Tuple4d local_60;
  Tuple4d local_40;
  
  operator*(&local_60,normal,2.0);
  s = dot(in,normal);
  operator*(&local_40,&local_60,s);
  operator-(__return_storage_ptr__,in,&local_40);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d math::reflect(const math::Tuple4d &in, const math::Tuple4d &normal)
{
    return in - normal * 2 * dot(in, normal);
}